

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_noCompressBlock(void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock)

{
  U32 cBlockHeader24;
  U32 lastBlock_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  if (dstCapacity < srcSize + 3) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    MEM_writeLE24(dst,lastBlock + (int)(srcSize << 3));
    memcpy((void *)((long)dst + 3),src,srcSize);
    dst_local = (void *)(srcSize + 3);
  }
  return (size_t)dst_local;
}

Assistant:

MEM_STATIC size_t ZSTD_noCompressBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize, U32 lastBlock)
{
    U32 const cBlockHeader24 = lastBlock + (((U32)bt_raw)<<1) + (U32)(srcSize << 3);
    RETURN_ERROR_IF(srcSize + ZSTD_blockHeaderSize > dstCapacity,
                    dstSize_tooSmall, "dst buf too small for uncompressed block");
    MEM_writeLE24(dst, cBlockHeader24);
    ZSTD_memcpy((BYTE*)dst + ZSTD_blockHeaderSize, src, srcSize);
    return ZSTD_blockHeaderSize + srcSize;
}